

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpack.c
# Opt level: O0

int fp_get_param(int argc,char **argv,fpstate *fpptr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ushort **ppuVar7;
  long lVar8;
  double dVar9;
  char local_468 [8];
  char tile [513];
  char local_258 [8];
  char tmp [513];
  int gotO;
  int gotR;
  int doffset;
  int ii;
  int ndim;
  int len;
  int iarg;
  int wholetile;
  int gottile;
  int gottype;
  fpstate *fpptr_local;
  char **argv_local;
  int argc_local;
  
  bVar3 = false;
  bVar4 = false;
  len = 0;
  bVar2 = false;
  bVar1 = false;
  if (fpptr->initialized != 0x2a) {
    fp_msg("Error: internal initialization error\n");
    exit(-1);
  }
  local_468[0] = '\0';
  ndim = 1;
  do {
    if ((argc <= ndim) ||
       ((((((*argv[ndim] != '-' || (sVar6 = strlen(argv[ndim]), sVar6 != 2)) &&
           (iVar5 = strncmp(argv[ndim],"-q",2), iVar5 != 0)) &&
          ((iVar5 = strncmp(argv[ndim],"-qz",3), iVar5 != 0 &&
           (iVar5 = strncmp(argv[ndim],"-g1",3), iVar5 != 0)))) &&
         ((iVar5 = strncmp(argv[ndim],"-g2",3), iVar5 != 0 &&
          ((iVar5 = strncmp(argv[ndim],"-i2f",4), iVar5 != 0 &&
           (iVar5 = strncmp(argv[ndim],"-n3ratio",8), iVar5 != 0)))))) &&
        ((iVar5 = strncmp(argv[ndim],"-n3min",6), iVar5 != 0 &&
         ((iVar5 = strncmp(argv[ndim],"-tableonly",10), iVar5 != 0 &&
          (iVar5 = strncmp(argv[ndim],"-table",6), iVar5 != 0)))))))) {
      if ((bVar2) && (fpptr->test_all == 0)) {
        fp_msg("Error: -R option may only be used with -T\n");
        exit(-1);
      }
      if ((bVar1) && ((fpptr->test_all != 0 || (fpptr->to_stdout != 0)))) {
        fp_msg("Error: -O option may not be used with -S or -T\n");
        exit(-1);
      }
      if ((((fpptr->scale != 0.0) || (NAN(fpptr->scale))) && (fpptr->comptype != 0x29)) &&
         (fpptr->test_all != 1)) {
        fp_msg("Error: `-s\' requires `-h or -T\'\n");
        exit(-1);
      }
      if ((fpptr->quantize_level == 0.0) && (!NAN(fpptr->quantize_level))) {
        if ((fpptr->comptype != 0x15) && (fpptr->comptype != 0x16)) {
          fp_msg("Error: `-q 0\' only allowed with GZIP\n");
          exit(-1);
        }
        if (fpptr->int_to_float == 1) {
          fp_msg("Error: `-q 0\' not allowed with -i2f\n");
          exit(-1);
        }
      }
      if (len == 0) {
        if (bVar4) {
          sVar6 = strlen(local_468);
          gotR = 0;
          doffset = 0;
          while (gotR < (int)sVar6) {
            ppuVar7 = __ctype_b_loc();
            if ((((*ppuVar7)[(int)local_468[gotR]] & 0x800) == 0) && (local_468[gotR] != ',')) {
              fp_msg("Error: `-t\' requires comma separated tile dims, ");
              fp_msg("e.g., `-t 100,100\'\n");
              exit(-1);
            }
            if (local_468[gotR] == ',') {
              gotR = gotR + 1;
            }
            else {
              lVar8 = atol(local_468 + gotR);
              fpptr->ntile[doffset] = lVar8;
              while (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)local_468[gotR]] & 0x800) != 0) {
                gotR = gotR + 1;
              }
              doffset = doffset + 1;
              if (6 < doffset) {
                fp_msg("Error: too many dimensions for `-t\', max=");
                snprintf(local_258,0x201,"%d\n",6);
                fp_msg(local_258);
                exit(-1);
              }
            }
          }
        }
      }
      else {
        for (doffset = 0; doffset < 6; doffset = doffset + 1) {
          fpptr->ntile[doffset] = -1;
        }
      }
      if (ndim < argc) {
        fpptr->firstfile = ndim;
        return 0;
      }
      fp_msg("Error: no FITS files to compress\n");
      fp_usage();
      exit(-1);
    }
    if (argv[ndim][1] == 'r') {
      fpptr->comptype = 0xb;
      if (bVar3) {
        fp_msg("Error: multiple compression flags\n");
        fp_usage();
        exit(-1);
      }
      bVar3 = true;
    }
    else if (argv[ndim][1] == 'p') {
      fpptr->comptype = 0x1f;
      if (bVar3) {
        fp_msg("Error: multiple compression flags\n");
        fp_usage();
        exit(-1);
      }
      bVar3 = true;
    }
    else if (argv[ndim][1] == 'g') {
      if (argv[ndim][2] == '2') {
        fpptr->comptype = 0x16;
      }
      else {
        fpptr->comptype = 0x15;
      }
      if (bVar3) {
        fp_msg("Error: multiple compression flags\n");
        fp_usage();
        exit(-1);
      }
      bVar3 = true;
    }
    else if (argv[ndim][1] == 'h') {
      fpptr->comptype = 0x29;
      if (bVar3) {
        fp_msg("Error: multiple compression flags\n");
        fp_usage();
        exit(-1);
      }
      bVar3 = true;
    }
    else if (argv[ndim][1] == 'd') {
      fpptr->comptype = -1;
      if (bVar3) {
        fp_msg("Error: multiple compression flags\n");
        fp_usage();
        exit(-1);
      }
      bVar3 = true;
    }
    else {
      iVar5 = strcmp(argv[ndim],"-i2f");
      if (iVar5 == 0) {
        fpptr->int_to_float = 1;
      }
      else {
        iVar5 = strcmp(argv[ndim],"-n3ratio");
        if (iVar5 == 0) {
          ndim = ndim + 1;
          if (argc <= ndim) {
            fp_usage();
            exit(-1);
          }
          dVar9 = atof(argv[ndim]);
          fpptr->n3ratio = (float)dVar9;
        }
        else {
          iVar5 = strcmp(argv[ndim],"-n3min");
          if (iVar5 == 0) {
            ndim = ndim + 1;
            if (argc <= ndim) {
              fp_usage();
              exit(-1);
            }
            dVar9 = atof(argv[ndim]);
            fpptr->n3min = (float)dVar9;
          }
          else if (argv[ndim][1] == 'q') {
            if (argv[ndim][2] == 'z') {
              fpptr->dither_method = 2;
              if (argv[ndim][3] == 't') {
                fpptr->dither_offset = -1;
              }
              else {
                ppuVar7 = __ctype_b_loc();
                if (((*ppuVar7)[(int)argv[ndim][3]] & 0x800) != 0) {
                  iVar5 = atoi(argv[ndim] + 3);
                  if (iVar5 == 0) {
                    fpptr->no_dither = 1;
                  }
                  else {
                    if ((iVar5 < 1) || (10000 < iVar5)) {
                      fp_msg("Error: invalid q suffix\n");
                      fp_usage();
                      exit(-1);
                    }
                    fpptr->dither_offset = iVar5;
                  }
                }
              }
            }
            else if (argv[ndim][2] == 't') {
              fpptr->dither_offset = -1;
            }
            else {
              ppuVar7 = __ctype_b_loc();
              if (((*ppuVar7)[(int)argv[ndim][2]] & 0x800) != 0) {
                iVar5 = atoi(argv[ndim] + 2);
                if (iVar5 == 0) {
                  fpptr->no_dither = 1;
                }
                else {
                  if ((iVar5 < 1) || (10000 < iVar5)) {
                    fp_msg("Error: invalid q suffix\n");
                    fp_usage();
                    exit(-1);
                  }
                  fpptr->dither_offset = iVar5;
                }
              }
            }
            ndim = ndim + 1;
            if (argc <= ndim) {
              fp_usage();
              exit(-1);
            }
            dVar9 = atof(argv[ndim]);
            fpptr->quantize_level = (float)dVar9;
          }
          else if (argv[ndim][1] == 'n') {
            ndim = ndim + 1;
            if (argc <= ndim) {
              fp_usage();
              exit(-1);
            }
            dVar9 = atof(argv[ndim]);
            fpptr->rescale_noise = (float)dVar9;
          }
          else if (argv[ndim][1] == 's') {
            ndim = ndim + 1;
            if (argc <= ndim) {
              fp_usage();
              exit(-1);
            }
            dVar9 = atof(argv[ndim]);
            fpptr->scale = (float)dVar9;
          }
          else {
            iVar5 = strcmp(argv[ndim],"-tableonly");
            if (iVar5 == 0) {
              fpptr->do_tables = 1;
              fpptr->do_images = 0;
              fprintf(_stderr,"Note: The table compression method used by fpack has been\n");
              fprintf(_stderr," officially approved as part of FITS format standard since 2016.\n");
              fprintf(_stderr," However users should be aware that the compressed table files may\n"
                     );
              fprintf(_stderr,
                      " only be readable by a limited number of applications (including fpack).\n");
            }
            else {
              iVar5 = strcmp(argv[ndim],"-table");
              if (iVar5 == 0) {
                fpptr->do_tables = 1;
                fprintf(_stderr,"Note: The table compression method used by fpack has been\n");
                fprintf(_stderr," officially approved as part of FITS format standard since 2016.\n"
                       );
                fprintf(_stderr,
                        " However users should be aware that the compressed table files may\n");
                fprintf(_stderr,
                        " only be readable by a limited number of applications (including fpack).\n"
                       );
              }
              else if (argv[ndim][1] == 't') {
                if (bVar4) {
                  fp_msg("Error: multiple tile specifications\n");
                  fp_usage();
                  exit(-1);
                }
                bVar4 = true;
                ndim = ndim + 1;
                if (argc <= ndim) {
                  fp_usage();
                  exit(-1);
                }
                strncpy(local_468,argv[ndim],0x200);
                tile[0x1f8] = '\0';
              }
              else if (argv[ndim][1] == 'v') {
                fpptr->verbose = 1;
              }
              else if (argv[ndim][1] == 'w') {
                len = len + 1;
                if (bVar4) {
                  fp_msg("Error: multiple tile specifications\n");
                  fp_usage();
                  exit(-1);
                }
                bVar4 = true;
              }
              else if (argv[ndim][1] == 'F') {
                fpptr->clobber = fpptr->clobber + 1;
              }
              else if (argv[ndim][1] == 'D') {
                fpptr->delete_input = fpptr->delete_input + 1;
              }
              else if (argv[ndim][1] == 'Y') {
                fpptr->do_not_prompt = fpptr->do_not_prompt + 1;
              }
              else if (argv[ndim][1] == 'S') {
                fpptr->to_stdout = fpptr->to_stdout + 1;
              }
              else if (argv[ndim][1] == 'L') {
                fpptr->listonly = fpptr->listonly + 1;
              }
              else if (argv[ndim][1] == 'C') {
                fpptr->do_checksums = 0;
              }
              else if (argv[ndim][1] == 'T') {
                fpptr->test_all = 1;
              }
              else {
                if (argv[ndim][1] == 'R') {
                  if (bVar1) {
                    fp_msg("Error: -R option is not allowed with -O\n");
                    exit(-1);
                  }
                  if (argc <= ndim + 1) {
                    fp_usage();
                    fp_hint();
                    exit(-1);
                  }
                  strncpy(fpptr->outfile,argv[ndim + 1],0x200);
                  fpptr->outfile[0x200] = '\0';
                  bVar2 = true;
                }
                else {
                  if (argv[ndim][1] == 'H') {
                    fp_help();
                    exit(0);
                  }
                  if (argv[ndim][1] == 'V') {
                    fp_version();
                    exit(0);
                  }
                  if (argv[ndim][1] != 'O') {
                    fp_msg("Error: unknown command line flag `");
                    fp_msg(argv[ndim]);
                    fp_msg("\'\n");
                    fp_usage();
                    fp_hint();
                    exit(-1);
                  }
                  if (bVar2) {
                    fp_msg("Error: -O option is not allowed with -R\n");
                    exit(-1);
                  }
                  if (argc <= ndim + 1) {
                    fp_usage();
                    fp_hint();
                    exit(-1);
                  }
                  strncpy(fpptr->outfile,argv[ndim + 1],0x200);
                  fpptr->outfile[0x200] = '\0';
                  bVar1 = true;
                }
                ndim = ndim + 1;
              }
            }
          }
        }
      }
    }
    ndim = ndim + 1;
  } while( true );
}

Assistant:

int fp_get_param (int argc, char *argv[], fpstate *fpptr)
{
	int	gottype=0, gottile=0, wholetile=0, iarg, len, ndim, ii, doffset;
        int     gotR=0, gotO=0;
	char	tmp[SZ_STR], tile[SZ_STR];

        if (fpptr->initialized != FP_INIT_MAGIC) {
            fp_msg ("Error: internal initialization error\n"); exit (-1);
        }

	tile[0] = 0;

	/* flags must come first and be separately specified
	 */
	for (iarg = 1; iarg < argc; iarg++) {
	    if ((argv[iarg][0] == '-' && strlen (argv[iarg]) == 2) ||
	        !strncmp(argv[iarg], "-q", 2) || !strncmp(argv[iarg], "-qz", 3) ||
	        !strncmp(argv[iarg], "-g1", 3) || !strncmp(argv[iarg], "-g2", 3) ||
	        !strncmp(argv[iarg], "-i2f", 4) ||
	        !strncmp(argv[iarg], "-n3ratio", 8) || !strncmp(argv[iarg], "-n3min", 6) ||
	        !strncmp(argv[iarg], "-tableonly", 10) || !strncmp(argv[iarg], "-table", 6) )  
	    {

		/* Rice is the default, so -r is superfluous  */
		if (       argv[iarg][1] == 'r') {
		    fpptr->comptype = RICE_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (argv[iarg][1] == 'p') {
		    fpptr->comptype = PLIO_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (argv[iarg][1] == 'g') {
		    /* test for modifiers following the 'g' */
                    if (argv[iarg][2] == '2')
		        fpptr->comptype = GZIP_2;
		    else
		        fpptr->comptype = GZIP_1;

		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;
/*
		} else if (argv[iarg][1] == 'b') {
		    fpptr->comptype = BZIP2_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;
*/
		} else if (argv[iarg][1] == 'h') {
		    fpptr->comptype = HCOMPRESS_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (argv[iarg][1] == 'd') {
		    fpptr->comptype = NOCOMPRESS;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (!strcmp(argv[iarg], "-i2f")) {
		    /* this means convert integer images to float, and then */
		    /* quantize and compress the float image.  This lossy */
		    /* compression method may give higher compression than the */
		    /* lossless compression method that is usually applied to */
		    /* integer images. */
		    
		    fpptr->int_to_float = 1;

		} else if (!strcmp(argv[iarg], "-n3ratio")) {
		    /* this is the minimum ratio between the MAD noise sigma */
		    /* and the q parameter value in the case where the integer */
		    /* image is quantized and compressed like a float image. */
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->n3ratio = (float) atof (argv[iarg]);
		    }
		} else if (!strcmp(argv[iarg], "-n3min")) {
		    /* this is the minimum  MAD noise sigma in the case where the */
		    /* integer image is quantized and compressed like a float image. */
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->n3min = (float) atof (argv[iarg]);
		    }
		} else if (argv[iarg][1] == 'q') {
		    /* test for modifiers following the 'q' */

                    if (argv[iarg][2] == 'z') {
		        fpptr->dither_method = 2;  /* preserve zero pixels */

                        if (argv[iarg][3] == 't') {
		            fpptr->dither_offset = -1;  /* dither based on tile checksum */

                        } else if (isdigit(argv[iarg][3])) { /* is a number appended to q? */
		           doffset = atoi(argv[iarg]+3);

                           if (doffset == 0) {
		              fpptr->no_dither = 1;  /* don't dither the quantized values */
		           } else if (doffset > 0 && doffset <= 10000) {
		              fpptr->dither_offset = doffset;
		           } else {
			      fp_msg ("Error: invalid q suffix\n");
			      fp_usage (); exit (-1);
		           }
			}
		    } else {
                        if (argv[iarg][2] == 't') {
		            fpptr->dither_offset = -1;  /* dither based on tile checksum */

                        } else if (isdigit(argv[iarg][2])) { /* is a number appended to q? */
		           doffset = atoi(argv[iarg]+2);

                           if (doffset == 0) {
		              fpptr->no_dither = 1;  /* don't dither the quantized values */
		           } else if (doffset > 0 && doffset <= 10000) {
		              fpptr->dither_offset = doffset;
		           } else {
			      fp_msg ("Error: invalid q suffix\n");
			      fp_usage (); exit (-1);
		           }
			}
		    }

		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->quantize_level = (float) atof (argv[iarg]);
		    }
		} else if (argv[iarg][1] == 'n') {
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->rescale_noise = (float) atof (argv[iarg]);
		    }
		} else if (argv[iarg][1] == 's') {
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->scale = (float) atof (argv[iarg]);
		    }
		} else if (!strcmp(argv[iarg], "-tableonly")) {
		    fpptr->do_tables = 1;
		    fpptr->do_images = 0;
                    /* Do not write this to stdout via fp_msg.  Otherwise it will be placed at start of piped FITS
                       file, which will then be corrupted. */
                    fprintf(stderr, "Note: The table compression method used by fpack has been\n");
		    fprintf(stderr, " officially approved as part of FITS format standard since 2016.\n");
		    fprintf(stderr, " However users should be aware that the compressed table files may\n");
		    fprintf(stderr, " only be readable by a limited number of applications (including fpack).\n");

		} else if (!strcmp(argv[iarg], "-table")) {
		    fpptr->do_tables = 1;
                    fprintf(stderr, "Note: The table compression method used by fpack has been\n");
		    fprintf(stderr, " officially approved as part of FITS format standard since 2016.\n");
		    fprintf(stderr, " However users should be aware that the compressed table files may\n");
		    fprintf(stderr, " only be readable by a limited number of applications (including fpack).\n");

		} else if (argv[iarg][1] == 't') {
		    if (gottile) {
			fp_msg ("Error: multiple tile specifications\n");
			fp_usage (); exit (-1);
		    } else
			gottile++;

		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			strncpy (tile, argv[iarg], SZ_STR-1); /* checked below */
                        tile[SZ_STR-1]=0;
                    }

		} else if (argv[iarg][1] == 'v') {
		    fpptr->verbose = 1;

		} else if (argv[iarg][1] == 'w') {
		    wholetile++;
		    if (gottile) {
			fp_msg ("Error: multiple tile specifications\n");
			fp_usage (); exit (-1);
		    } else
			gottile++;

		} else if (argv[iarg][1] == 'F') {
		    fpptr->clobber++;       /* overwrite existing file */

		} else if (argv[iarg][1] == 'D') {
		    fpptr->delete_input++;

		} else if (argv[iarg][1] == 'Y') {
		    fpptr->do_not_prompt++;

		} else if (argv[iarg][1] == 'S') {
		    fpptr->to_stdout++;

		} else if (argv[iarg][1] == 'L') {
		    fpptr->listonly++;

		} else if (argv[iarg][1] == 'C') {
		    fpptr->do_checksums = 0;

		} else if (argv[iarg][1] == 'T') {
		    fpptr->test_all = 1;

		} else if (argv[iarg][1] == 'R') {
                    if (gotO) {
                        fp_msg("Error: -R option is not allowed with -O\n");
                        exit(-1);
		    } else if (++iarg >= argc) {
			fp_usage (); fp_hint (); exit (-1);
		    } else {
			strncpy (fpptr->outfile, argv[iarg], SZ_STR-1);
                        fpptr->outfile[SZ_STR-1]=0;
                        gotR=1;
                    }

		} else if (argv[iarg][1] == 'H') {
		    fp_help (); exit (0);

		} else if (argv[iarg][1] == 'V') {
		    fp_version (); exit (0);
                    
                } else if (argv[iarg][1] == 'O') {
                    if (gotR) {
                        fp_msg("Error: -O option is not allowed with -R\n");
                        exit(-1);
		    } else if (++iarg >= argc) {
			fp_usage (); fp_hint (); exit (-1);
		    } else {
			strncpy (fpptr->outfile, argv[iarg], SZ_STR-1);
                        fpptr->outfile[SZ_STR-1]=0;
                        gotO=1;
                    }
                
		} else {
		    fp_msg ("Error: unknown command line flag `");
		    fp_msg (argv[iarg]); fp_msg ("'\n");
		    fp_usage (); fp_hint (); exit (-1);
		}

	    } else
		break;
	}

        /* In earlier loop, already made sure both -O and -R are not being used.
           This is essential, as each must store info in the same 'outfile' array. 
           Now do additional tests of -O and -R with other flags. */
        
        if (gotR && !fpptr->test_all) {
            fp_msg("Error: -R option may only be used with -T\n"); exit(-1);
        }
        
        if (gotO && (fpptr->test_all || fpptr->to_stdout)) {
            fp_msg("Error: -O option may not be used with -S or -T\n"); exit(-1);
        }
        
	if (fpptr->scale != 0. && 
	         fpptr->comptype != HCOMPRESS_1 && fpptr->test_all != 1) {

	    fp_msg ("Error: `-s' requires `-h or -T'\n"); exit (-1);
	}

	if (fpptr->quantize_level == 0) {
	
	    if ((fpptr->comptype != GZIP_1) && (fpptr->comptype != GZIP_2)) {
	        fp_msg ("Error: `-q 0' only allowed with GZIP\n"); exit (-1);
	    }

            if (fpptr->int_to_float == 1) {
	        fp_msg ("Error: `-q 0' not allowed with -i2f\n"); exit (-1);
	    }
	}

	if (wholetile) {
	    for (ndim=0; ndim < MAX_COMPRESS_DIM; ndim++)
		fpptr->ntile[ndim] = (long) -1;

	} else if (gottile) {
	    len = strlen (tile);
	    for (ii=0, ndim=0; ii < len; ) {
		if (! (isdigit (tile[ii]) || tile[ii] == ',')) {
		    fp_msg ("Error: `-t' requires comma separated tile dims, ");
		    fp_msg ("e.g., `-t 100,100'\n"); exit (-1);
		}

		if (tile[ii] == ',') { ii++; continue; }

		fpptr->ntile[ndim] = atol (&tile[ii]);
		for ( ; isdigit(tile[ii]); ii++);

		if (++ndim > MAX_COMPRESS_DIM) {
		    fp_msg ("Error: too many dimensions for `-t', max=");
		    snprintf (tmp, SZ_STR,"%d\n", MAX_COMPRESS_DIM); fp_msg (tmp);
		    exit (-1);
		}
	    }
	}

	if (iarg >= argc) {
	    fp_msg ("Error: no FITS files to compress\n");
	    fp_usage (); exit (-1);
	} else
	    fpptr->firstfile = iarg;

	return(0);
}